

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O2

FT_Error FT_Bitmap_Embolden(FT_Library library,FT_Bitmap *bitmap,FT_Pos xStrength,FT_Pos yStrength)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  FT_Error FVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  FT_Memory memory;
  byte *__s;
  uchar *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uchar *in;
  byte *pbVar18;
  uchar *__src;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uchar *out;
  byte *pbVar22;
  byte *pbVar23;
  uchar *puVar24;
  uchar *puVar25;
  bool bVar26;
  uchar *limit;
  FT_Bitmap tmp;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (bitmap == (FT_Bitmap *)0x0) {
    return 6;
  }
  if (bitmap->buffer == (uchar *)0x0) {
    return 6;
  }
  if (0x1fffffffdf < yStrength || 0x1fffffffdf < xStrength) {
    return 6;
  }
  uVar6 = (int)xStrength + 0x20;
  uVar11 = (int)yStrength + 0x20;
  if ((uVar11 | uVar6) < 0x40) goto LAB_0022ca4a;
  iVar7 = (int)uVar6 >> 6;
  iVar12 = (int)uVar11 >> 6;
  if ((int)(uVar11 | uVar6) >> 6 < 0) {
    return 6;
  }
  uVar6 = (uint)bitmap->pixel_mode;
  iVar5 = 8;
  FVar4 = 0;
  switch(uVar6) {
  case 1:
    iVar5 = 8;
    if (iVar7 < 8) {
      iVar5 = iVar7;
    }
    iVar7 = iVar5;
    memory = library->memory;
    uVar19 = bitmap->rows;
    uVar21 = bitmap->width;
    uVar11 = bitmap->pitch;
    uVar6 = -uVar11;
    if (0 < (int)uVar11) {
      uVar6 = uVar11;
    }
    uVar16 = (ulong)uVar6;
    goto switchD_0022c69c_caseD_1;
  case 3:
  case 4:
    tmp.buffer = (uchar *)0x0;
    tmp.num_grays = 0;
    tmp.pixel_mode = '\0';
    tmp.palette_mode = '\0';
    tmp._28_4_ = 0;
    tmp.rows = 0;
    tmp.width = 0;
    tmp.pitch = 0;
    tmp._12_4_ = 0;
    tmp.palette = (void *)0x0;
    FVar4 = FT_Bitmap_Convert(library,bitmap,&tmp,1);
    if (FVar4 != 0) {
      return FVar4;
    }
    FT_Bitmap_Done(library,bitmap);
    bitmap->rows = tmp.rows;
    bitmap->width = tmp.width;
    bitmap->pitch = tmp.pitch;
    *(undefined4 *)&bitmap->field_0xc = tmp._12_4_;
    bitmap->buffer = tmp.buffer;
    bitmap->num_grays = tmp.num_grays;
    bitmap->pixel_mode = tmp.pixel_mode;
    bitmap->palette_mode = tmp.palette_mode;
    *(undefined4 *)&bitmap->field_0x1c = tmp._28_4_;
    bitmap->palette = tmp.palette;
    uVar6 = (uint)bitmap->pixel_mode;
    break;
  case 5:
    iVar7 = iVar7 * 3;
    goto LAB_0022c6ff;
  case 6:
    iVar12 = iVar12 * 3;
LAB_0022c6ff:
    memory = library->memory;
    uVar19 = bitmap->rows;
    uVar21 = bitmap->width;
    uVar11 = bitmap->pitch;
    uVar16 = (ulong)-uVar11;
    if (0 < (int)uVar11) {
      uVar16 = (ulong)uVar11;
    }
    goto switchD_0022c69c_caseD_2;
  case 7:
    goto switchD_0022c603_caseD_7;
  }
  uVar11 = bitmap->pitch;
  uVar19 = -uVar11;
  if (0 < (int)uVar11) {
    uVar19 = uVar11;
  }
  uVar16 = (ulong)uVar19;
  if (uVar6 - 1 < 6) {
    memory = library->memory;
    uVar19 = bitmap->rows;
    uVar21 = bitmap->width;
    switch(uVar6) {
    case 1:
switchD_0022c69c_caseD_1:
      uVar6 = uVar21 + iVar7 + 7 >> 3;
      iVar5 = 1;
      break;
    default:
switchD_0022c69c_caseD_2:
      uVar6 = uVar21 + iVar7;
      break;
    case 3:
      uVar6 = uVar21 + iVar7 + 3 >> 2;
      iVar5 = 2;
      break;
    case 4:
      uVar6 = uVar21 + iVar7 + 1 >> 1;
      iVar5 = 4;
    }
    uVar15 = (uint)uVar16;
    if ((iVar12 == 0) && (uVar6 <= uVar15)) {
      uVar6 = iVar5 * (uVar21 + iVar7);
      if (uVar6 < uVar15 << 3) {
        pbVar18 = bitmap->buffer + (uVar6 >> 3);
        pbVar22 = bitmap->buffer + uVar16;
        pbVar23 = pbVar22;
        while (bVar26 = uVar19 != 0, uVar19 = uVar19 - 1, bVar26) {
          __s = pbVar18;
          if ((uVar6 & 7) != 0) {
            *pbVar18 = *pbVar18 & (byte)(0xff00 >> (sbyte)(uVar6 & 7));
            __s = pbVar18 + 1;
          }
          if (__s < pbVar23) {
            memset(__s,0,(long)pbVar22 - (long)__s);
          }
          pbVar18 = pbVar18 + uVar16;
          pbVar22 = pbVar22 + uVar16;
          pbVar23 = pbVar23 + uVar16;
        }
        uVar11 = bitmap->pitch;
      }
    }
    else {
      puVar14 = (uchar *)ft_mem_qrealloc(memory,(ulong)uVar6,0,(ulong)(uVar19 + iVar12),(void *)0x0,
                                         (FT_Error *)&tmp);
      if (tmp.rows != 0) {
        return tmp.rows;
      }
      uVar11 = iVar5 * uVar21 + 7 >> 3;
      __src = bitmap->buffer;
      puVar24 = __src + uVar15 * bitmap->rows;
      uVar9 = (ulong)uVar11;
      uVar17 = (ulong)(uVar6 - uVar11);
      puVar25 = puVar14;
      if (bitmap->pitch < 1) {
        for (; __src < puVar24; __src = __src + uVar16) {
          memcpy(puVar25,__src,uVar9);
          memset(puVar25 + uVar9,0,uVar17);
          puVar25 = puVar25 + uVar9 + uVar17;
        }
        memset(puVar25,0,(ulong)(uVar6 * iVar12));
      }
      else {
        memset(puVar14,0,(ulong)(uVar6 * iVar12));
        puVar25 = puVar14 + uVar6 * iVar12;
        for (; __src < puVar24; __src = __src + uVar16) {
          memcpy(puVar25,__src,uVar9);
          memset(puVar25 + uVar9,0,uVar17);
          puVar25 = puVar25 + uVar9 + uVar17;
        }
      }
      ft_mem_free(memory,bitmap->buffer);
      bitmap->buffer = puVar14;
      uVar11 = -uVar6;
      if (-1 < bitmap->pitch) {
        uVar11 = uVar6;
      }
      bitmap->pitch = uVar11;
    }
    if ((int)uVar11 < 1) {
      uVar11 = -uVar11;
      uVar6 = (bitmap->rows - 1) * uVar11;
    }
    else {
      uVar6 = uVar11 * iVar12;
    }
    puVar14 = bitmap->buffer + uVar6;
    uVar16 = (ulong)uVar11;
    for (uVar6 = 0; lVar13 = uVar16 - 2, uVar9 = uVar16, uVar6 < bitmap->rows; uVar6 = uVar6 + 1) {
      while (0 < (long)uVar9) {
        uVar17 = uVar9 - 1;
        bVar1 = puVar14[uVar9 - 1];
        uVar11 = (uint)bVar1;
        bVar3 = 7;
        lVar20 = lVar13;
        for (lVar8 = 1; lVar8 <= iVar7; lVar8 = lVar8 + 1) {
          if (bitmap->pixel_mode == '\x01') {
            bVar10 = (byte)uVar11 | bVar1 >> ((byte)lVar8 & 0x1f);
            uVar11 = (uint)bVar10;
            puVar14[uVar9 - 1] = bVar10;
            if (uVar9 != 1) {
              bVar10 = bVar10 | puVar14[uVar9 - 2] << (bVar3 & 0x1f);
              uVar11 = (uint)bVar10;
              puVar14[uVar9 - 1] = bVar10;
            }
          }
          else {
            if (lVar20 < 0) break;
            uVar11 = (uint)puVar14[lVar20] + (uVar11 & 0xff);
            if (bitmap->num_grays <= uVar11) {
              puVar14[uVar17] = (char)bitmap->num_grays + 0xff;
              break;
            }
            puVar14[uVar17] = (uchar)uVar11;
            if ((uVar11 & 0xff) == bitmap->num_grays - 1) break;
          }
          bVar3 = bVar3 - 1;
          lVar20 = lVar20 + -1;
        }
        lVar13 = lVar13 + -1;
        uVar9 = uVar17;
      }
      iVar5 = 1;
      while( true ) {
        iVar2 = bitmap->pitch;
        if (iVar12 < iVar5) break;
        for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
          puVar14[uVar9 - (long)(iVar2 * iVar5)] =
               puVar14[uVar9 - (long)(iVar2 * iVar5)] | puVar14[uVar9];
        }
        iVar5 = iVar5 + 1;
      }
      puVar14 = puVar14 + iVar2;
    }
    bitmap->width = bitmap->width + iVar7;
    bitmap->rows = bitmap->rows + iVar12;
LAB_0022ca4a:
    FVar4 = 0;
  }
  else {
    FVar4 = 0x12;
  }
switchD_0022c603_caseD_7:
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Embolden( FT_Library  library,
                      FT_Bitmap*  bitmap,
                      FT_Pos      xStrength,
                      FT_Pos      yStrength )
  {
    FT_Error        error;
    unsigned char*  p;
    FT_Int          i, x, pitch;
    FT_UInt         y;
    FT_Int          xstr, ystr;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap || !bitmap->buffer )
      return FT_THROW( Invalid_Argument );

    if ( ( ( FT_PIX_ROUND( xStrength ) >> 6 ) > FT_INT_MAX ) ||
         ( ( FT_PIX_ROUND( yStrength ) >> 6 ) > FT_INT_MAX ) )
      return FT_THROW( Invalid_Argument );

    xstr = (FT_Int)FT_PIX_ROUND( xStrength ) >> 6;
    ystr = (FT_Int)FT_PIX_ROUND( yStrength ) >> 6;

    if ( xstr == 0 && ystr == 0 )
      return FT_Err_Ok;
    else if ( xstr < 0 || ystr < 0 )
      return FT_THROW( Invalid_Argument );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
      {
        FT_Bitmap  tmp;


        /* convert to 8bpp */
        FT_Bitmap_Init( &tmp );
        error = FT_Bitmap_Convert( library, bitmap, &tmp, 1 );
        if ( error )
          return error;

        FT_Bitmap_Done( library, bitmap );
        *bitmap = tmp;
      }
      break;

    case FT_PIXEL_MODE_MONO:
      if ( xstr > 8 )
        xstr = 8;
      break;

    case FT_PIXEL_MODE_LCD:
      xstr *= 3;
      break;

    case FT_PIXEL_MODE_LCD_V:
      ystr *= 3;
      break;

    case FT_PIXEL_MODE_BGRA:
      /* We don't embolden color glyphs. */
      return FT_Err_Ok;
    }

    error = ft_bitmap_assure_buffer( library->memory, bitmap,
                                     (FT_UInt)xstr, (FT_UInt)ystr );
    if ( error )
      return error;

    /* take care of bitmap flow */
    pitch = bitmap->pitch;
    if ( pitch > 0 )
      p = bitmap->buffer + pitch * ystr;
    else
    {
      pitch = -pitch;
      p = bitmap->buffer + (FT_UInt)pitch * ( bitmap->rows - 1 );
    }

    /* for each row */
    for ( y = 0; y < bitmap->rows; y++ )
    {
      /*
       * Horizontally:
       *
       * From the last pixel on, make each pixel or'ed with the
       * `xstr' pixels before it.
       */
      for ( x = pitch - 1; x >= 0; x-- )
      {
        unsigned char  tmp;


        tmp = p[x];
        for ( i = 1; i <= xstr; i++ )
        {
          if ( bitmap->pixel_mode == FT_PIXEL_MODE_MONO )
          {
            p[x] |= tmp >> i;

            /* the maximum value of 8 for `xstr' comes from here */
            if ( x > 0 )
              p[x] |= p[x - 1] << ( 8 - i );

#if 0
            if ( p[x] == 0xFF )
              break;
#endif
          }
          else
          {
            if ( x - i >= 0 )
            {
              if ( p[x] + p[x - i] > bitmap->num_grays - 1 )
              {
                p[x] = (unsigned char)( bitmap->num_grays - 1 );
                break;
              }
              else
              {
                p[x] = (unsigned char)( p[x] + p[x - i] );
                if ( p[x] == bitmap->num_grays - 1 )
                  break;
              }
            }
            else
              break;
          }
        }
      }

      /*
       * Vertically:
       *
       * Make the above `ystr' rows or'ed with it.
       */
      for ( x = 1; x <= ystr; x++ )
      {
        unsigned char*  q;


        q = p - bitmap->pitch * x;
        for ( i = 0; i < pitch; i++ )
          q[i] |= p[i];
      }

      p += bitmap->pitch;
    }

    bitmap->width += (FT_UInt)xstr;
    bitmap->rows += (FT_UInt)ystr;

    return FT_Err_Ok;
  }